

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O0

string * __thiscall
cmOSXBundleGenerator::InitMacOSXContentDirectory
          (string *__return_storage_ptr__,cmOSXBundleGenerator *this,char *pkgloc,string *config)

{
  string *__s;
  string local_110 [39];
  allocator<char> local_e9;
  undefined1 local_e8 [8];
  string loc;
  cmAlphaNum local_c0;
  string local_80;
  cmAlphaNum local_60;
  undefined1 local_29;
  string *local_28;
  string *config_local;
  char *pkgloc_local;
  cmOSXBundleGenerator *this_local;
  string *macdir;
  
  local_29 = 0;
  local_28 = config;
  config_local = (string *)pkgloc;
  pkgloc_local = (char *)this;
  this_local = (cmOSXBundleGenerator *)__return_storage_ptr__;
  cmGeneratorTarget::GetMacContentDirectory(&local_80,this->GT,config,RuntimeBinaryArtifact);
  cmAlphaNum::cmAlphaNum(&local_60,&local_80);
  cmAlphaNum::cmAlphaNum(&local_c0,'/');
  cmStrCat<char_const*>(__return_storage_ptr__,&local_60,&local_c0,(char **)&config_local);
  std::__cxx11::string::~string((string *)&local_80);
  loc.field_2._8_8_ = cmsys::SystemTools::MakeDirectory(__return_storage_ptr__,(mode_t *)0x0);
  __s = config_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_e8,(char *)__s,&local_e9);
  std::allocator<char>::~allocator(&local_e9);
  std::__cxx11::string::find((char)local_e8,0x2f);
  std::__cxx11::string::substr((ulong)local_110,(ulong)local_e8);
  std::__cxx11::string::operator=((string *)local_e8,local_110);
  std::__cxx11::string::~string(local_110);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(this->MacContentFolders,(value_type *)local_e8);
  std::__cxx11::string::~string((string *)local_e8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmOSXBundleGenerator::InitMacOSXContentDirectory(
  const char* pkgloc, const std::string& config)
{
  // Construct the full path to the content subdirectory.

  std::string macdir = cmStrCat(this->GT->GetMacContentDirectory(
                                  config, cmStateEnums::RuntimeBinaryArtifact),
                                '/', pkgloc);
  cmSystemTools::MakeDirectory(macdir);

  // Record use of this content location.  Only the first level
  // directory is needed.
  {
    std::string loc = pkgloc;
    loc = loc.substr(0, loc.find('/'));
    this->MacContentFolders->insert(loc);
  }

  return macdir;
}